

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void GPU_FreeRenderer(GPU_Renderer *renderer)

{
  GPU_RendererID id;
  undefined8 in_stack_ffffffffffffffc0;
  GPU_RendererID local_38;
  GPU_Renderer *local_20;
  GPU_Renderer *current_renderer;
  GPU_Renderer *pGStack_10;
  int i;
  GPU_Renderer *renderer_local;
  
  if (renderer != (GPU_Renderer *)0x0) {
    pGStack_10 = renderer;
    local_20 = GPU_GetCurrentRenderer();
    if (local_20 == pGStack_10) {
      GPU_MakeRendererID(&local_38,"Unknown",0,0,0);
      id.renderer = local_38.minor_version;
      id.major_version = local_38._20_4_;
      id.name = (char *)local_38._8_8_;
      id._16_8_ = in_stack_ffffffffffffffc0;
      GPU_SetCurrentRenderer(id);
    }
    for (current_renderer._4_4_ = 0; current_renderer._4_4_ < 0x14;
        current_renderer._4_4_ = current_renderer._4_4_ + 1) {
      if (pGStack_10 == _gpu_renderer_map[current_renderer._4_4_]) {
        gpu_free_renderer_memory(pGStack_10);
        _gpu_renderer_map[current_renderer._4_4_] = (GPU_Renderer *)0x0;
        return;
      }
    }
  }
  return;
}

Assistant:

void GPU_FreeRenderer(GPU_Renderer* renderer)
{
	int i;
	GPU_Renderer* current_renderer;
	
	if(renderer == NULL)
        return;
	
    current_renderer = GPU_GetCurrentRenderer();
    if(current_renderer == renderer)
        GPU_SetCurrentRenderer(GPU_MakeRendererID("Unknown", GPU_RENDERER_UNKNOWN, 0, 0));
        
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(renderer == _gpu_renderer_map[i])
		{
			gpu_free_renderer_memory(renderer);
			_gpu_renderer_map[i] = NULL;
			return;
		}
	}
}